

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# p3ch18ex11.cpp
# Opt level: O0

void __thiscall SkipList::Print(SkipList *this)

{
  ostream *poVar1;
  Node *local_28;
  Node *node;
  Node *pNStack_18;
  int lvl;
  Node *head;
  SkipList *this_local;
  
  node._4_4_ = this->height;
  for (pNStack_18 = this->header; pNStack_18 != (Node *)0x0; pNStack_18 = pNStack_18->bot) {
    poVar1 = std::operator<<((ostream *)&std::cout,"\n[");
    poVar1 = (ostream *)std::ostream::operator<<(poVar1,node._4_4_);
    std::operator<<(poVar1,"] - ");
    for (local_28 = pNStack_18; local_28 != (Node *)0x0; local_28 = local_28->next) {
      poVar1 = std::operator<<((ostream *)&std::cout,"{ ");
      poVar1 = (ostream *)std::ostream::operator<<(poVar1,local_28->key);
      poVar1 = std::operator<<(poVar1," ");
      poVar1 = std::operator<<(poVar1,(string *)&local_28->val);
      std::operator<<(poVar1," }");
      if (local_28->next != (Node *)0x0) {
        std::operator<<((ostream *)&std::cout,", ");
      }
    }
    std::operator<<((ostream *)&std::cout,"\n");
    node._4_4_ = node._4_4_ + -1;
  }
  return;
}

Assistant:

void SkipList::Print() const
{
	Node* head = header;
	int lvl = height;
	while(head)
	{
		std::cout << "\n[" << lvl << "] - ";
		Node* node = head;
		while(node)
		{
			std::cout << "{ " << node->key << " " << node->val << " }";
			if (node->next)
			{
				std::cout << ", ";
			}
			node = node->next;
		}
		std::cout << "\n";
		head = head->bot;
		lvl--;
	}
}